

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O1

double __thiscall DiStefano::Alloc(DiStefano *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  int *piVar7;
  bool *pbVar8;
  double dVar9;
  double dVar10;
  Mat local_78 [96];
  
  lVar6 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar6;
  piVar7 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_78,*piVar7,piVar7[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_78);
  cv::Mat::~Mat(local_78);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar6 = (long)((*(int *)&pMVar4->field_0xc - (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
          (long)((*(int *)&pMVar4->field_0x8 - (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1);
  piVar7 = (int *)operator_new__(-(ulong)(lVar6 + 1U >> 0x3e != 0) | lVar6 * 4 + 4U);
  this->a_class = piVar7;
  pbVar8 = (bool *)operator_new__((long)((*(int *)&pMVar4->field_0xc -
                                         (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                  (long)((*(int *)&pMVar4->field_0x8 -
                                         (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1);
  this->a_single = pbVar8;
  lVar6 = (long)((*(int *)&pMVar4->field_0xc - (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
          (long)((*(int *)&pMVar4->field_0x8 - (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1);
  piVar7 = (int *)operator_new__(-(ulong)(lVar6 + 1U >> 0x3e != 0) | lVar6 * 4 + 4U);
  this->a_renum = piVar7;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  memset(this->a_class,0,
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  memset(this->a_single,0,
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  memset(this->a_renum,0,
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  lVar6 = cv::getTickCount();
  dVar9 = (double)lVar6 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar9;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar9;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  lVar6 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar6;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  memset(this->a_class,0,
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  memset(this->a_single,0,
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  memset(this->a_renum,0,
         (long)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
         (long)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) * 4 + 4);
  lVar6 = cv::getTickCount();
  dVar10 = (double)lVar6 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar10;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar10;
  return (dVar9 * 1000.0) / dVar1 -
         (dVar10 * 1000.0) /
         (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }